

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build_parser.cpp
# Opt level: O0

void Omega_h::compute_context_set
               (int zeta_j_addr,Contexts *contexts,vector<bool,_std::allocator<bool>_> *complete,
               StateConfigs *scs,ParserGraph *originator_graph,StatesInProgress *states,
               ParserGraph *states2scs,Configs *cs,
               vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               *first_sets,GrammarPtr *grammar,bool verbose)

{
  size_t *this;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  NodeEdges *this_00;
  reference piVar5;
  element_type *peVar6;
  size_type sVar7;
  reference pvVar8;
  reference rVar9;
  shared_ptr<const_Omega_h::Grammar> local_348;
  reference local_338;
  reference local_328;
  int local_314;
  undefined1 auStack_310 [4];
  value_type tau_addr;
  _Bit_type local_308;
  int local_2fc;
  undefined1 auStack_2f8 [4];
  value_type addr;
  _Bit_type local_2f0;
  byte local_2e1;
  undefined1 local_2e0 [7];
  bool keep_lane_popping;
  reference local_2d0;
  shared_ptr<const_Omega_h::Grammar> local_2c0;
  reference local_2b0;
  shared_ptr<const_Omega_h::Grammar> local_2a0;
  shared_ptr<const_Omega_h::Grammar> local_290;
  shared_ptr<const_Omega_h::Grammar> local_280;
  reference local_270;
  shared_ptr<const_Omega_h::Grammar> local_260;
  reference local_250;
  shared_ptr<const_Omega_h::Grammar> local_240;
  key_type local_22c;
  shared_ptr<const_Omega_h::Grammar> local_228;
  set<int,_std::less<int>,_std::allocator<int>_> local_218;
  Context local_1e8;
  shared_ptr<const_Omega_h::Grammar> local_1b8;
  shared_ptr<const_Omega_h::Grammar> local_1a8;
  undefined1 local_198 [8];
  FirstSet gamma_first;
  shared_ptr<const_Omega_h::Grammar> local_158;
  undefined1 local_148 [8];
  vector<int,_std::allocator<int>_> gamma;
  const_iterator cStack_128;
  int zeta_prime_addr;
  const_iterator __end2;
  const_iterator __begin2;
  NodeEdges *__range2;
  int first_originator_failed;
  int num_originators_failed;
  int zeta_pointer;
  value_type zeta_addr;
  Context contexts_generated;
  undefined1 auStack_c8 [7];
  bool tests_failed;
  _Bit_type local_c0;
  bool local_b5 [13];
  undefined1 local_a8 [8];
  vector<bool,_std::allocator<bool>_> in_lane;
  vector<int,_std::allocator<int>_> lane;
  vector<int,_std::allocator<int>_> stack;
  bool verbose_local;
  StatesInProgress *states_local;
  ParserGraph *originator_graph_local;
  StateConfigs *scs_local;
  vector<bool,_std::allocator<bool>_> *complete_local;
  Contexts *contexts_local;
  int zeta_j_addr_local;
  
  contexts_local._4_4_ = zeta_j_addr;
  if (verbose) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Computing context set for $\\zeta_j$ = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,contexts_local._4_4_);
    std::operator<<(poVar3,"...\n");
    std::operator<<((ostream *)&std::cerr,"BEGIN PROGRAM\n");
  }
  join_0x00000010_0x00000000_ = at<bool>(complete,contexts_local._4_4_);
  bVar1 = std::_Bit_reference::operator_cast_to_bool
                    ((_Bit_reference *)
                     &stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    if (verbose) {
      poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,contexts_local._4_4_);
      std::operator<<(poVar3," was already complete!\nEND PROGRAM\n\n");
    }
    return;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  iVar2 = size<Omega_h::StateConfig>(scs);
  local_b5[0] = false;
  make_vector<bool>((vector<bool,_std::allocator<bool>_> *)local_a8,iVar2,local_b5);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,(value_type_conflict1 *)((long)&contexts_local + 4));
  _auStack_c8 = at<bool>((vector<bool,_std::allocator<bool>_> *)local_a8,contexts_local._4_4_);
  std::_Bit_reference::operator=((_Bit_reference *)auStack_c8,true);
  contexts_generated._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&zeta_pointer);
  if (verbose) {
    std::operator<<((ostream *)&std::cerr,"Initial LANE:");
    print_stack((vector<int,_std::allocator<int>_> *)
                &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_end_of_storage);
  }
  do {
    while( true ) {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)
                         &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
      if (bVar1) {
        fail("assertion %s failed at %s +%d\n","!lane.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
             ,0x316);
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage);
      num_originators_failed = *pvVar4;
      if (verbose) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Top of LANE is $\\zeta$ = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,num_originators_failed);
        std::operator<<(poVar3,'\n');
      }
      iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                        &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage);
      first_originator_failed = iVar2 + -1;
      if (verbose) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"$\\zeta$-POINTER <- ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,first_originator_failed);
        std::operator<<(poVar3,'\n');
      }
      __range2._4_4_ = 0;
      __range2._0_4_ = 0xffffffff;
      if (verbose) {
        std::operator<<((ostream *)&std::cerr,"DO_LOOP:\n");
      }
      this_00 = get_edges(originator_graph,num_originators_failed);
      __end2 = std::vector<int,_std::allocator<int>_>::begin(this_00);
      cStack_128 = std::vector<int,_std::allocator<int>_>::end(this_00);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffed8);
        if (!bVar1) break;
        piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end2);
        gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = *piVar5;
        if (verbose) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Next originator of $\\zeta$ = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,num_originators_failed);
          poVar3 = std::operator<<(poVar3," is $\\zeta\'$ = ");
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (poVar3,gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_);
          std::operator<<(poVar3,'\n');
        }
        iVar2 = gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._4_4_;
        std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_158,grammar);
        get_follow_string((vector<int,_std::allocator<int>_> *)local_148,iVar2,scs,states,cs,
                          &local_158);
        std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_158);
        if (verbose) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"  FOLLOW string of $\\zeta\'$ = ");
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (poVar3,gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_);
          std::operator<<(poVar3," is ");
          this = &gamma_first._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::shared_ptr<const_Omega_h::Grammar>::shared_ptr
                    ((shared_ptr<const_Omega_h::Grammar> *)this,grammar);
          print_string((vector<int,_std::allocator<int>_> *)local_148,(GrammarPtr *)this);
          std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr
                    ((shared_ptr<const_Omega_h::Grammar> *)
                     &gamma_first._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::operator<<((ostream *)&std::cerr,'\n');
        }
        get_first_set_of_string
                  ((FirstSet *)local_198,(vector<int,_std::allocator<int>_> *)local_148,first_sets);
        if (verbose) {
          std::operator<<((ostream *)&std::cerr,"  FIRST set of ");
          std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_1a8,grammar);
          print_string((vector<int,_std::allocator<int>_> *)local_148,&local_1a8);
          std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_1a8);
          std::operator<<((ostream *)&std::cerr," is ");
          peVar6 = std::
                   __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)grammar);
          print_set((set<int,_std::less<int>,_std::allocator<int>_> *)local_198,peVar6);
          std::operator<<((ostream *)&std::cerr,"\n");
        }
        bVar1 = has_non_null_terminal_descendant((FirstSet *)local_198);
        if (bVar1) {
          if (verbose) {
            std::operator<<((ostream *)&std::cerr,"  ");
            std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_1b8,grammar);
            print_string((vector<int,_std::allocator<int>_> *)local_148,&local_1b8);
            std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_1b8);
            std::operator<<((ostream *)&std::cerr," has a non-null terminal descendant\n");
          }
          std::set<int,_std::less<int>,_std::allocator<int>_>::set
                    (&local_218,(set<int,_std::less<int>,_std::allocator<int>_> *)local_198);
          get_contexts(&local_1e8,&local_218);
          std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&zeta_pointer,&local_1e8);
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_1e8);
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_218);
          if (verbose) {
            std::operator<<((ostream *)&std::cerr,"  CONTEXTS_GENERATED = ");
            peVar6 = std::
                     __shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)grammar);
            print_set((set<int,_std::less<int>,_std::allocator<int>_> *)&zeta_pointer,peVar6);
            std::operator<<((ostream *)&std::cerr," = 1-heads of non-null descendants of ");
            std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_228,grammar);
            print_string((vector<int,_std::allocator<int>_> *)local_148,&local_228);
            std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_228);
            std::operator<<((ostream *)&std::cerr,'\n');
          }
          local_22c = -0x1a9;
          sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_198,&local_22c)
          ;
          iVar2 = first_originator_failed;
          if (sVar7 == 0) {
            std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_290,grammar);
            context_adding_routine
                      ((vector<int,_std::allocator<int>_> *)
                       &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage,iVar2,(Context *)&zeta_pointer,
                       contexts,verbose,&local_290);
            std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_290);
          }
          else {
            if (verbose) {
              std::operator<<((ostream *)&std::cerr,"  ");
              std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_240,grammar);
              print_string((vector<int,_std::allocator<int>_> *)local_148,&local_240);
              std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_240);
              std::operator<<((ostream *)&std::cerr," has a null terminal descendant\n");
            }
            rVar9 = at<bool>(complete,gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage._4_4_);
            local_250 = rVar9;
            bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_250);
            if (bVar1) {
              pvVar8 = at<std::set<int,std::less<int>,std::allocator<int>>>
                                 (contexts,gamma.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              unite_with<int>((set<int,_std::less<int>,_std::allocator<int>_> *)&zeta_pointer,pvVar8
                             );
              iVar2 = first_originator_failed;
              std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_260,grammar);
              context_adding_routine
                        ((vector<int,_std::allocator<int>_> *)
                         &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,iVar2,(Context *)&zeta_pointer,
                         contexts,verbose,&local_260);
              std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_260);
            }
            else {
              rVar9 = at<bool>((vector<bool,_std::allocator<bool>_> *)local_a8,
                               gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
              local_270 = rVar9;
              bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_270);
              iVar2 = first_originator_failed;
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                std::operator<<((ostream *)&std::cerr,"ERROR: grammar is ambiguous.\n");
                abort();
              }
              std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_280,grammar);
              context_adding_routine
                        ((vector<int,_std::allocator<int>_> *)
                         &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,iVar2,(Context *)&zeta_pointer,
                         contexts,verbose,&local_280);
              std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_280);
              deal_with_tests_failed
                        ((int *)((long)&__range2 + 4),(int *)&__range2,
                         gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,
                         (bool *)((long)&contexts_generated._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count + 7),
                         (vector<int,_std::allocator<int>_> *)
                         &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,
                         (vector<bool,_std::allocator<bool>_> *)local_a8,num_originators_failed,
                         (vector<int,_std::allocator<int>_> *)
                         &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,verbose);
            }
          }
        }
        else {
          if (verbose) {
            std::operator<<((ostream *)&std::cerr,"  ");
            std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_2a0,grammar);
            print_string((vector<int,_std::allocator<int>_> *)local_148,&local_2a0);
            std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_2a0);
            std::operator<<((ostream *)&std::cerr," does not have a non-null terminal descendant\n")
            ;
          }
          rVar9 = at<bool>(complete,gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          local_2b0 = rVar9;
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_2b0);
          if (bVar1) {
            if (verbose) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"  COMPLETE(");
              poVar3 = (ostream *)
                       std::ostream::operator<<
                                 (poVar3,gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage._4_4_);
              std::operator<<(poVar3,") is ON\n");
            }
            pvVar8 = at<std::set<int,std::less<int>,std::allocator<int>>>
                               (contexts,gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage._4_4_);
            std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&zeta_pointer,pvVar8);
            iVar2 = first_originator_failed;
            std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_2c0,grammar);
            context_adding_routine
                      ((vector<int,_std::allocator<int>_> *)
                       &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage,iVar2,(Context *)&zeta_pointer,
                       contexts,verbose,&local_2c0);
            std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_2c0);
          }
          else {
            if (verbose) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"  COMPLETE(");
              poVar3 = (ostream *)
                       std::ostream::operator<<
                                 (poVar3,gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage._4_4_);
              std::operator<<(poVar3,") is OFF\n");
            }
            rVar9 = at<bool>((vector<bool,_std::allocator<bool>_> *)local_a8,
                             gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_);
            local_2d0 = rVar9;
            bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_2d0);
            if (bVar1) {
              if (verbose) {
                poVar3 = std::operator<<((ostream *)&std::cerr,"  IN_LANE(");
                poVar3 = (ostream *)
                         std::ostream::operator<<
                                   (poVar3,gamma.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
                std::operator<<(poVar3,") is ON\n");
              }
              move_markers((vector<int,_std::allocator<int>_> *)
                           &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage,
                           gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,first_originator_failed,
                           (bool)(contexts_generated._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count._7_1_ & 1));
              pvVar8 = at<std::set<int,std::less<int>,std::allocator<int>>>
                                 (contexts,gamma.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&zeta_pointer,pvVar8);
              iVar2 = first_originator_failed;
              std::shared_ptr<const_Omega_h::Grammar>::shared_ptr
                        ((shared_ptr<const_Omega_h::Grammar> *)local_2e0,grammar);
              context_adding_routine
                        ((vector<int,_std::allocator<int>_> *)
                         &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,iVar2,(Context *)&zeta_pointer,
                         contexts,verbose,(shared_ptr<const_Omega_h::Grammar> *)local_2e0);
              std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr
                        ((shared_ptr<const_Omega_h::Grammar> *)local_2e0);
            }
            else {
              if (verbose) {
                poVar3 = std::operator<<((ostream *)&std::cerr,"  IN_LANE(");
                poVar3 = (ostream *)
                         std::ostream::operator<<
                                   (poVar3,gamma.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
                std::operator<<(poVar3,") is OFF\n");
              }
              deal_with_tests_failed
                        ((int *)((long)&__range2 + 4),(int *)&__range2,
                         gamma.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,
                         (bool *)((long)&contexts_generated._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count + 7),
                         (vector<int,_std::allocator<int>_> *)
                         &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,
                         (vector<bool,_std::allocator<bool>_> *)local_a8,num_originators_failed,
                         (vector<int,_std::allocator<int>_> *)
                         &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,verbose);
            }
          }
        }
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)local_198);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_148);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end2);
      }
      if (verbose) {
        std::operator<<((ostream *)&std::cerr,"END DO_LOOP\n");
      }
      if ((contexts_generated._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0)
      break;
      if (verbose) {
        std::operator<<((ostream *)&std::cerr,
                        "  TESTS_FAILED was on, turning it off and going to next configuration\n");
      }
      contexts_generated._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    }
    local_2e1 = 1;
    if (verbose) {
      std::operator<<((ostream *)&std::cerr,"  Start LANE popping\n");
    }
LAB_0038a8b1:
  } while ((local_2e1 & 1) == 0);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)
                     &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
  if (bVar1) {
    fail("assertion %s failed at %s +%d\n","!lane.empty()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
         ,0x388);
  }
  if (verbose) {
    std::operator<<((ostream *)&std::cerr,"  LANE:");
    print_stack((vector<int,_std::allocator<int>_> *)
                &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_end_of_storage);
  }
  iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                    &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage);
  pvVar4 = at<int>((vector<int,_std::allocator<int>_> *)
                   &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,iVar2 + -1);
  if (*pvVar4 == -0x1b1) {
    if (verbose) {
      std::operator<<((ostream *)&std::cerr,"  Top of LANE is a marker\n");
      std::operator<<((ostream *)&std::cerr,"  Start STACK popping\n");
    }
    while( true ) {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)
                         &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        fail("assertion %s failed at %s +%d\n","!stack.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_build_parser.cpp"
             ,0x391);
      }
      if (verbose) {
        std::operator<<((ostream *)&std::cerr,"    STACK:");
        print_stack((vector<int,_std::allocator<int>_> *)
                    &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        std::operator<<((ostream *)&std::cerr,"    LANE:");
        print_stack((vector<int,_std::allocator<int>_> *)
                    &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage);
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      if (*pvVar4 == -0x1b1) {
        if (verbose) {
          std::operator<<((ostream *)&std::cerr,"    Top of STACK is a marker, pop STACK and LANE\n"
                         );
        }
        iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                          &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
        resize<int>((vector<int,_std::allocator<int>_> *)
                    &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,iVar2 + -1);
        iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                          &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage);
        resize<int>((vector<int,_std::allocator<int>_> *)
                    &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,iVar2 + -1);
        goto LAB_0038a8b1;
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      rVar9 = at<bool>(complete,*pvVar4);
      _auStack_2f8 = rVar9;
      bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_2f8);
      if (!bVar1) break;
      if (verbose) {
        std::operator<<((ostream *)&std::cerr,"    Top of STACK is has COMPLETE flag, pop STACK\n");
      }
      iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                        &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      resize<int>((vector<int,_std::allocator<int>_> *)
                  &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,iVar2 + -1);
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)
                        &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    local_2fc = *pvVar4;
    if (verbose) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    Top of STACK is ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2fc);
      std::operator<<(poVar3,", pop STACK\n");
    }
    iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                      &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    resize<int>((vector<int,_std::allocator<int>_> *)
                &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage,iVar2 + -1);
    if (verbose) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    Push ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2fc);
      std::operator<<(poVar3," onto LANE\n");
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage,&local_2fc);
    if (verbose) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    IN_LANE(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2fc);
      std::operator<<(poVar3,") <- ON\n");
    }
    rVar9 = at<bool>((vector<bool,_std::allocator<bool>_> *)local_a8,local_2fc);
    _auStack_310 = rVar9;
    std::_Bit_reference::operator=((_Bit_reference *)auStack_310,true);
    local_2e1 = 0;
  }
  else {
    iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                      &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage);
    pvVar4 = at<int>((vector<int,_std::allocator<int>_> *)
                     &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage,iVar2 + -1);
    if (*pvVar4 == -100) {
      if (verbose) {
        std::operator<<((ostream *)&std::cerr,"  Top of LANE is a zero\n");
        std::operator<<((ostream *)&std::cerr,"  Pop LANE\n");
      }
      iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                        &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage);
      resize<int>((vector<int,_std::allocator<int>_> *)
                  &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage,iVar2 + -1);
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage);
      local_314 = *pvVar4;
      if (verbose) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"  Top of LANE is $\\tau$ = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_314);
        std::operator<<(poVar3,"\n");
      }
      rVar9 = at<bool>((vector<bool,_std::allocator<bool>_> *)local_a8,local_314);
      local_328 = rVar9;
      std::_Bit_reference::operator=(&local_328,false);
      if (verbose) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"  IN_LANE(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_314);
        std::operator<<(poVar3,") <- OFF\n");
      }
      rVar9 = at<bool>(complete,local_314);
      local_338 = rVar9;
      std::_Bit_reference::operator=(&local_338,true);
      if (verbose) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"  COMPLETE(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_314);
        std::operator<<(poVar3,") <- ON\n");
        std::operator<<((ostream *)&std::cerr,"  HEURISTIC PROPAGATION OF CONTEXT SETS\n");
      }
      iVar2 = local_314;
      std::shared_ptr<const_Omega_h::Grammar>::shared_ptr(&local_348,grammar);
      heuristic_propagation_of_context_sets
                (iVar2,contexts,complete,scs,states,states2scs,cs,&local_348);
      std::shared_ptr<const_Omega_h::Grammar>::~shared_ptr(&local_348);
      iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                        &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage);
      if (iVar2 == 1) {
        pvVar4 = at<int>((vector<int,_std::allocator<int>_> *)
                         &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,0);
        if (*pvVar4 == contexts_local._4_4_) {
          if (verbose) {
            std::operator<<((ostream *)&std::cerr,"END PROGRAM\n\n");
          }
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)&zeta_pointer);
          std::vector<bool,_std::allocator<bool>_>::~vector
                    ((vector<bool,_std::allocator<bool>_> *)local_a8);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     &lane.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          return;
        }
      }
      if (verbose) {
        std::operator<<((ostream *)&std::cerr,"  Pop LANE\n");
      }
      iVar2 = size<int>((vector<int,_std::allocator<int>_> *)
                        &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage);
      resize<int>((vector<int,_std::allocator<int>_> *)
                  &in_lane.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage,iVar2 + -1);
    }
  }
  goto LAB_0038a8b1;
}

Assistant:

static void compute_context_set(int zeta_j_addr, Contexts& contexts,
    std::vector<bool>& complete, StateConfigs const& scs,
    ParserGraph const& originator_graph, StatesInProgress const& states,
    ParserGraph const& states2scs, Configs const& cs,
    std::vector<FirstSet> const& first_sets, GrammarPtr grammar, bool verbose) {
  if (verbose)
    std::cerr << "Computing context set for $\\zeta_j$ = " << zeta_j_addr
              << "...\n";
  if (verbose) std::cerr << "BEGIN PROGRAM\n";
  if (at(complete, zeta_j_addr)) {
    if (verbose)
      std::cerr << zeta_j_addr << " was already complete!\nEND PROGRAM\n\n";
    return;
  }
  std::vector<int> stack;
  // need random access, inner insert, which std::stack doesn't provide
  std::vector<int> lane;
  auto in_lane = make_vector<bool>(size(scs), false);
  lane.push_back(zeta_j_addr);
  at(in_lane, zeta_j_addr) = true;
  bool tests_failed = false;
  Context contexts_generated;
  if (verbose) {
    std::cerr << "Initial LANE:";
    print_stack(lane);
  }
  while (true) {
    OMEGA_H_CHECK(!lane.empty());
    auto zeta_addr = lane.back();
    if (verbose) {
      std::cerr << "Top of LANE is $\\zeta$ = " << zeta_addr << '\n';
    }
    auto zeta_pointer = size(lane) - 1;
    if (verbose) std::cerr << "$\\zeta$-POINTER <- " << zeta_pointer << '\n';
    int num_originators_failed = 0;
    int first_originator_failed = -1;
    if (verbose) std::cerr << "DO_LOOP:\n";
    /* DO_LOOP */
    for (auto zeta_prime_addr : get_edges(originator_graph, zeta_addr)) {
      if (verbose) {
        std::cerr << "Next originator of $\\zeta$ = " << zeta_addr
                  << " is $\\zeta'$ = " << zeta_prime_addr << '\n';
      }
      auto gamma = get_follow_string(zeta_prime_addr, scs, states, cs, grammar);
      if (verbose) {
        std::cerr << "  FOLLOW string of $\\zeta'$ = " << zeta_prime_addr
                  << " is ";
        print_string(gamma, grammar);
        std::cerr << '\n';
      }
      auto gamma_first = get_first_set_of_string(gamma, first_sets);
      if (verbose) {
        std::cerr << "  FIRST set of ";
        print_string(gamma, grammar);
        std::cerr << " is ";
        print_set(gamma_first, *grammar);
        std::cerr << "\n";
      }
      if (has_non_null_terminal_descendant(gamma_first)) {  // test A
        if (verbose) {
          std::cerr << "  ";
          print_string(gamma, grammar);
          std::cerr << " has a non-null terminal descendant\n";
        }
        contexts_generated = get_contexts(gamma_first);
        if (verbose) {
          std::cerr << "  CONTEXTS_GENERATED = ";
          print_set(contexts_generated, *grammar);
          std::cerr << " = 1-heads of non-null descendants of ";
          print_string(gamma, grammar);
          std::cerr << '\n';
        }
        if (gamma_first.count(FIRST_NULL)) {
          if (verbose) {
            std::cerr << "  ";
            print_string(gamma, grammar);
            std::cerr << " has a null terminal descendant\n";
          }
          if (at(complete, zeta_prime_addr)) {
            unite_with(contexts_generated, at(contexts, zeta_prime_addr));
            context_adding_routine(lane, zeta_pointer, contexts_generated,
                contexts, verbose, grammar);
          } else if (!at(in_lane, zeta_prime_addr)) {
            context_adding_routine(lane, zeta_pointer, contexts_generated,
                contexts, verbose, grammar);
            /* TRACE_FURTHER */
            deal_with_tests_failed(num_originators_failed,
                first_originator_failed, zeta_prime_addr, tests_failed, lane,
                in_lane, zeta_addr, stack, verbose);
          } else {
            std::cerr << "ERROR: grammar is ambiguous.\n";
            abort();
          }
        } else {
          context_adding_routine(lane, zeta_pointer, contexts_generated,
              contexts, verbose, grammar);
        }
      } else {
        if (verbose) {
          std::cerr << "  ";
          print_string(gamma, grammar);
          std::cerr << " does not have a non-null terminal descendant\n";
        }
        if (at(complete, zeta_prime_addr)) {  // test B
          if (verbose)
            std::cerr << "  COMPLETE(" << zeta_prime_addr << ") is ON\n";
          contexts_generated = at(contexts, zeta_prime_addr);
          context_adding_routine(lane, zeta_pointer, contexts_generated,
              contexts, verbose, grammar);
        } else {
          if (verbose)
            std::cerr << "  COMPLETE(" << zeta_prime_addr << ") is OFF\n";
          if (at(in_lane, zeta_prime_addr)) {  // test C
            if (verbose)
              std::cerr << "  IN_LANE(" << zeta_prime_addr << ") is ON\n";
            move_markers(lane, zeta_prime_addr, zeta_pointer, tests_failed);
            contexts_generated = at(contexts, zeta_prime_addr);
            context_adding_routine(lane, zeta_pointer, contexts_generated,
                contexts, verbose, grammar);
          } else {
            if (verbose)
              std::cerr << "  IN_LANE(" << zeta_prime_addr << ") is OFF\n";
            deal_with_tests_failed(num_originators_failed,
                first_originator_failed, zeta_prime_addr, tests_failed, lane,
                in_lane, zeta_addr, stack, verbose);
          }
        }
      }
    } /* END DO_LOOP */
    if (verbose) std::cerr << "END DO_LOOP\n";
    if (tests_failed) {
      if (verbose) {
        std::cerr << "  TESTS_FAILED was on, turning it off and going to next "
                     "configuration\n";
      }
      tests_failed = false;
      continue;
    }
    bool keep_lane_popping = true;
    if (verbose) std::cerr << "  Start LANE popping\n";
    while (keep_lane_popping) {  // LANE popping loop
      OMEGA_H_CHECK(!lane.empty());
      if (verbose) {
        std::cerr << "  LANE:";
        print_stack(lane);
      }
      if (at(lane, size(lane) - 1) == MARKER) {
        if (verbose) std::cerr << "  Top of LANE is a marker\n";
        if (verbose) std::cerr << "  Start STACK popping\n";
        while (true) {  // STACK popping loop
          OMEGA_H_CHECK(!stack.empty());
          if (verbose) {
            std::cerr << "    STACK:";
            print_stack(stack);
            std::cerr << "    LANE:";
            print_stack(lane);
          }
          if (stack.back() == MARKER) {
            if (verbose)
              std::cerr << "    Top of STACK is a marker, pop STACK and LANE\n";
            resize(stack, size(stack) - 1);
            resize(lane, size(lane) - 1);
            break;  // out of STACK popping, back into LANE popping
          } else if (at(complete, stack.back())) {
            if (verbose)
              std::cerr << "    Top of STACK is has COMPLETE flag, pop STACK\n";
            resize(stack, size(stack) - 1);
            // back into STACK popping
          } else {
            auto addr = stack.back();
            if (verbose)
              std::cerr << "    Top of STACK is " << addr << ", pop STACK\n";
            resize(stack, size(stack) - 1);
            if (verbose) std::cerr << "    Push " << addr << " onto LANE\n";
            lane.push_back(addr);
            if (verbose) std::cerr << "    IN_LANE(" << addr << ") <- ON\n";
            at(in_lane, addr) = true;
            keep_lane_popping = false;
            break;  // out of STACK and LANE popping, into top-level loop
          }         // end STACK top checks
        }           // end STACK popping loop
      } else if (at(lane, size(lane) - 1) == ZERO) {
        if (verbose) std::cerr << "  Top of LANE is a zero\n";
        if (verbose) std::cerr << "  Pop LANE\n";
        resize(lane, size(lane) - 1);  // pop LANE
        // back to top of LANE popping loop
      } else {  // top of LANE neither marker nor zero
        auto tau_addr = lane.back();
        if (verbose)
          std::cerr << "  Top of LANE is $\\tau$ = " << tau_addr << "\n";
        at(in_lane, tau_addr) = false;
        if (verbose) std::cerr << "  IN_LANE(" << tau_addr << ") <- OFF\n";
        at(complete, tau_addr) = true;
        if (verbose) std::cerr << "  COMPLETE(" << tau_addr << ") <- ON\n";
        if (verbose) std::cerr << "  HEURISTIC PROPAGATION OF CONTEXT SETS\n";
        heuristic_propagation_of_context_sets(
            tau_addr, contexts, complete, scs, states, states2scs, cs, grammar);
        if (size(lane) == 1 && at(lane, 0) == zeta_j_addr) {
          if (verbose) std::cerr << "END PROGRAM\n\n";
          return;
        }
        if (verbose) std::cerr << "  Pop LANE\n";
        resize(lane, size(lane) - 1);  // pop LANE
        // back to top of LANE popping loop
      }  // end top of LANE checks
    }    // end LANE popping loop
  }      // end top-level while(1) loop
}